

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

string * ReadAll(string *__return_storage_ptr__,string *filename)

{
  char *pcVar1;
  streambuf *psVar2;
  stringstream local_3a8 [8];
  stringstream stream;
  undefined1 local_398 [376];
  undefined1 local_220 [8];
  ifstream file;
  string *filename_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar1,_S_in);
  std::__cxx11::stringstream::stringstream(local_3a8);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_398,psVar2);
  std::ifstream::close();
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3a8);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

static std::string ReadAll(const std::string& filename)
{
  cmsys::ifstream file(filename.c_str());
  cmsys_ios::stringstream stream;
  stream << file.rdbuf();
  file.close();
  return stream.str();
}